

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void sparc_tr_init_disas_context(DisasContextBase *dcbase,CPUState *cs)

{
  void *pvVar1;
  _Bool _Var2;
  int local_40;
  int bound;
  CPUSPARCState_conflict2 *env;
  DisasContextBase *__mptr;
  DisasContext_conflict8 *dc;
  CPUState *cs_local;
  DisasContextBase *dcbase_local;
  
  pvVar1 = cs->env_ptr;
  dcbase[4].pc_next = (target_ulong)cs->uc;
  dcbase[1].tb = (TranslationBlock *)dcbase->pc_first;
  dcbase[1].pc_first = dcbase->tb->cs_base;
  *(undefined4 *)&dcbase[2].tb = 0;
  dcbase[1].max_insns = dcbase->tb->flags & 7;
  dcbase[2].pc_first = (long)pvVar1 + 0x2080;
  _Var2 = tb_fpu_enabled(dcbase->tb->flags);
  dcbase[1].singlestep_enabled = _Var2;
  _Var2 = tb_am_enabled(dcbase->tb->flags);
  dcbase[1].field_0x25 = _Var2;
  dcbase[1].field_0x26 = (dcbase->tb->flags & 0x40) != 0;
  *(undefined4 *)&dcbase[4].pc_first = 0;
  *(uint32_t *)((long)&dcbase[4].pc_first + 4) = dcbase->tb->flags >> 0x18;
  local_40 = (int)(-(dcbase->pc_first | 0xffffffffffffe000) >> 2);
  if (dcbase->max_insns < local_40) {
    local_40 = dcbase->max_insns;
  }
  dcbase->max_insns = local_40;
  return;
}

Assistant:

static void sparc_tr_init_disas_context(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    CPUSPARCState *env = cs->env_ptr;
    int bound;

    // unicorn setup
    dc->uc = cs->uc;

    dc->pc = dc->base.pc_first;
    dc->npc = (target_ulong)dc->base.tb->cs_base;
    dc->cc_op = CC_OP_DYNAMIC;
    dc->mem_idx = dc->base.tb->flags & TB_FLAG_MMU_MASK;
    dc->def = &env->def;
    dc->fpu_enabled = tb_fpu_enabled(dc->base.tb->flags);
    dc->address_mask_32bit = tb_am_enabled(dc->base.tb->flags);
    dc->supervisor = (dc->base.tb->flags & TB_FLAG_SUPER) != 0;
#ifdef TARGET_SPARC64
    dc->fprs_dirty = 0;
    dc->asi = (dc->base.tb->flags >> TB_FLAG_ASI_SHIFT) & 0xff;
#endif
    /*
     * if we reach a page boundary, we stop generation so that the
     * PC of a TT_TFAULT exception is always in the right page
     */
#ifdef _MSC_VER
    bound = (0 - (dc->base.pc_first | TARGET_PAGE_MASK)) / 4;
#else
    bound = -(dc->base.pc_first | TARGET_PAGE_MASK) / 4;
#endif
    dc->base.max_insns = MIN(dc->base.max_insns, bound);
}